

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParseException.cpp
# Opt level: O1

SAXParseException * __thiscall
xercesc_4_0::SAXParseException::operator=(SAXParseException *this,SAXParseException *toAssign)

{
  short *psVar1;
  MemoryManager *pMVar2;
  XMLCh *pXVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar6;
  XMLCh *pXVar5;
  
  if (this != toAssign) {
    pMVar2 = (this->super_SAXException).fMemoryManager;
    (*pMVar2->_vptr_MemoryManager[4])(pMVar2,this->fPublicId);
    pMVar2 = (this->super_SAXException).fMemoryManager;
    (*pMVar2->_vptr_MemoryManager[4])(pMVar2,this->fSystemId);
    SAXException::operator=(&this->super_SAXException,&toAssign->super_SAXException);
    this->fColumnNumber = toAssign->fColumnNumber;
    this->fLineNumber = toAssign->fLineNumber;
    pXVar3 = toAssign->fPublicId;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      pMVar2 = (this->super_SAXException).fMemoryManager;
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fPublicId = pXVar5;
    pXVar3 = toAssign->fSystemId;
    if (pXVar3 == (XMLCh *)0x0) {
      pXVar5 = (XMLCh *)0x0;
    }
    else {
      pMVar2 = (this->super_SAXException).fMemoryManager;
      sVar6 = 0;
      do {
        psVar1 = (short *)((long)pXVar3 + sVar6);
        sVar6 = sVar6 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar6);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
      memcpy(pXVar5,pXVar3,sVar6);
    }
    this->fSystemId = pXVar5;
  }
  return this;
}

Assistant:

SAXParseException&
SAXParseException::operator=(const SAXParseException& toAssign)
{
    if (this == &toAssign)
        return *this;

    fMemoryManager->deallocate(fPublicId);//XMLString::release(&fPublicId);
    fMemoryManager->deallocate(fSystemId);//XMLString::release(&fSystemId);

    this->SAXException::operator =(toAssign);
    fColumnNumber = toAssign.fColumnNumber;
    fLineNumber = toAssign.fLineNumber;

    fPublicId = XMLString::replicate(toAssign.fPublicId, fMemoryManager);
    fSystemId = XMLString::replicate(toAssign.fSystemId, fMemoryManager);

    return *this;
}